

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void diy::
     Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     ::load(BinaryBuffer *bb,String *s)

{
  ulong uVar1;
  char c;
  size_t sz;
  char local_29;
  ulong local_28;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_28,8);
  std::__cxx11::string::resize((ulong)s,(char)local_28);
  if (local_28 != 0) {
    uVar1 = 0;
    do {
      (*bb->_vptr_BinaryBuffer[4])(bb,&local_29,1);
      (s->_M_dataplus)._M_p[uVar1] = local_29;
      uVar1 = uVar1 + 1;
    } while (uVar1 < local_28);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, String& s)
    {
      size_t sz;
      diy::load(bb, sz);
      s.resize(sz);
      for (size_t i = 0; i < sz; ++i)
      {
          char c;
          diy::load(bb, c);
          s[i] = c;
      }
    }